

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTxyz.hpp
# Opt level: O1

void __thiscall OpenMD::NPTxyz::~NPTxyz(NPTxyz *this)

{
  pointer pVVar1;
  
  (this->super_NPTf).super_NPT.super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NPT_002feb78;
  pVVar1 = (this->super_NPTf).super_NPT.oldJi.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->super_NPTf).super_NPT.oldJi.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  pVVar1 = (this->super_NPTf).super_NPT.oldVel.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->super_NPTf).super_NPT.oldVel.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  pVVar1 = (this->super_NPTf).super_NPT.oldPos.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->super_NPTf).super_NPT.oldPos.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  Integrator::~Integrator((Integrator *)this);
  operator_delete(this,0x328);
  return;
}

Assistant:

NPTxyz(SimInfo* info) : NPTf(info) {}